

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall tetgenmesh::recoversubfaces(tetgenmesh *this,arraypool *misshlist,int steinerflag)

{
  tetrahedron *pppdVar1;
  uint *puVar2;
  arraypool *paVar3;
  shellface endpt;
  ulong uVar4;
  memorypool *pmVar5;
  bool bVar6;
  point pdVar7;
  int i;
  int iVar8;
  int iVar9;
  long lVar10;
  tetrahedron ppdVar11;
  undefined4 *puVar12;
  ulong uVar13;
  shellface *pppdVar14;
  tetrahedron *pppdVar15;
  char *pcVar16;
  shellface ppdVar17;
  ulong uVar18;
  uint uVar19;
  tetrahedron *pppdVar20;
  shellface ppdVar21;
  face searchsh;
  point steinerpt;
  face bdsegs [3];
  face local_118;
  triface local_108;
  shellface local_f8;
  int local_ec;
  point local_e8;
  arraypool *local_e0;
  face afStack_d8 [3];
  insertvertexflags local_a8;
  
  local_108.tet = (tetrahedron *)0x0;
  local_108.ver = 0;
  local_118.sh = (shellface *)0x0;
  local_118.shver = 0;
  lVar10 = 8;
  do {
    *(undefined8 *)((long)&local_e0 + lVar10) = 0;
    *(undefined4 *)((long)&afStack_d8[0].sh + lVar10) = 0;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x38);
  local_a8.refinetet.ver = 0;
  local_a8.refinesh.shver = 0;
  local_a8.refinetet.tet = (tetrahedron *)0x0;
  local_a8.refinesh.sh = (shellface *)0x0;
  local_a8.smlenflag = 0;
  local_a8.smlen = 0.0;
  local_a8.iloc = 0;
  local_a8.bowywat = 0;
  local_a8.lawson = 0;
  local_a8.splitbdflag = 0;
  local_a8.validflag = 0;
  local_a8.respectbdflag = 0;
  local_a8.rejflag = 0;
  local_a8.chkencflag = 0;
  local_a8.cdtflag = 0;
  local_a8.assignmeshsize = 0;
  local_a8.sloc = 0;
  local_a8.sbowywat = 0;
  local_a8.refineflag = 0;
  local_ec = steinerflag;
  local_e0 = misshlist;
  if (1 < this->b->verbose) {
    uVar19 = this->b->fliplinklevel;
    if ((int)uVar19 < 1) {
      pcVar16 = "auto";
      uVar19 = this->autofliplinklevel;
    }
    else {
      pcVar16 = "fixed";
    }
    printf("    Recover subfaces [%s level = %2d] #:  %ld.\n",pcVar16,(ulong)uVar19,
           this->subfacstack->objects);
  }
  paVar3 = this->subfacstack;
  lVar10 = paVar3->objects;
  do {
    if (lVar10 < 1) {
      return 0;
    }
    uVar13 = lVar10 - 1;
    paVar3->objects = uVar13;
    lVar10 = (long)paVar3->objectbytes * ((long)paVar3->objectsperblockmark & uVar13);
    local_118.sh = *(shellface **)
                    (paVar3->toparray[uVar13 >> ((byte)paVar3->log2objectsperblock & 0x3f)] + lVar10
                    );
    local_118.shver =
         *(int *)(paVar3->toparray[uVar13 >> ((byte)paVar3->log2objectsperblock & 0x3f)] +
                 lVar10 + 8);
    if ((local_118.sh[3] != (shellface)0x0) &&
       (local_118.sh[(ulong)(local_118.shver & 1) + 9] < (shellface)0x10)) {
      if (2 < this->b->verbose) {
        lVar10 = (long)this->pointmarkindex;
        printf("      Recover subface (%d, %d, %d).\n",
               (ulong)*(uint *)((long)local_118.sh[sorgpivot[local_118.shver]] + lVar10 * 4),
               (ulong)*(uint *)((long)local_118.sh[sdestpivot[local_118.shver]] + lVar10 * 4),
               (ulong)*(uint *)((long)local_118.sh[sapexpivot[local_118.shver]] + lVar10 * 4));
      }
      ppdVar17 = (shellface)0x0;
LAB_0013db13:
      ppdVar21 = local_118.sh[(long)(local_118.shver >> 1) + 6];
      afStack_d8[(long)ppdVar17].shver = (uint)ppdVar21 & 7;
      pppdVar14 = (shellface *)((ulong)ppdVar21 & 0xfffffffffffffff8);
      afStack_d8[(long)ppdVar17].sh = pppdVar14;
      if (pppdVar14 != (shellface *)0x0) {
        local_108.ver = (uint)pppdVar14[9] & 0xf;
        local_108.tet = (tetrahedron *)((ulong)pppdVar14[9] & 0xfffffffffffffff0);
        if (local_108.tet != (tetrahedron *)0x0) break;
        local_108.tet = (tetrahedron *)0x0;
        goto LAB_0013e4b1;
      }
      ppdVar21 = local_118.sh[sorgpivot[local_118.shver]];
      endpt = local_118.sh[sdestpivot[local_118.shver]];
      local_108.tet = (tetrahedron *)((ulong)ppdVar21[this->point2simindex] & 0xfffffffffffffff0);
      if (local_108.tet[4] == ppdVar21) {
        local_108.ver = 0xb;
      }
      else if (local_108.tet[5] == ppdVar21) {
        local_108.ver = 3;
      }
      else {
        local_108.ver = 0;
        if (local_108.tet[6] == ppdVar21) {
          local_108.ver = 7;
        }
      }
      local_f8 = ppdVar17;
      finddirection(this,&local_108,(point)endpt);
      if (((local_108.tet[destpivot[local_108.ver]] == endpt) ||
          (iVar9 = recoveredgebyflips(this,(point)ppdVar21,(point)endpt,&local_118,&local_108,0),
          iVar9 != 0)) ||
         (iVar9 = recoveredgebyflips(this,(point)endpt,(point)ppdVar21,&local_118,&local_108,0),
         iVar9 != 0)) {
        makeshellface(this,this->subsegs,afStack_d8 + (long)ppdVar17);
        pppdVar15 = local_108.tet;
        pppdVar14 = afStack_d8[(long)ppdVar17].sh;
        uVar13 = (ulong)afStack_d8[(long)ppdVar17].shver;
        pppdVar14[sorgpivot[uVar13]] = ppdVar21;
        pppdVar14[sdestpivot[uVar13]] = endpt;
        pppdVar14[sapexpivot[uVar13]] = (shellface)0x0;
        puVar2 = (uint *)((long)pppdVar14 + (long)this->shmarkindex * 4 + 4);
        *puVar2 = *puVar2 | 4;
        ppdVar21 = (shellface)(uVar13 | (ulong)pppdVar14);
        local_118.sh[(long)(local_118.shver >> 1) + 6] = ppdVar21;
        *pppdVar14 = (shellface)((long)local_118.shver | (ulong)local_118.sh);
        ppdVar17 = local_118.sh[local_118.shver >> 1];
        if (((ulong)ppdVar17 & 0xfffffffffffffff8) != 0) {
          *(shellface *)
           (((ulong)ppdVar17 & 0xfffffffffffffff8) + 0x30 + (ulong)((uint)ppdVar17 & 6) * 4) =
               ppdVar21;
          *pppdVar14 = ppdVar17;
        }
        uVar13 = (ulong)local_108.ver;
        pppdVar14[9] = (shellface)(uVar13 | (ulong)local_108.tet);
        pppdVar20 = local_108.tet;
        do {
          ppdVar11 = pppdVar20[8];
          if (ppdVar11 == (tetrahedron)0x0) {
            ppdVar11 = (tetrahedron)memorypool::alloc(this->tet2segpool);
            pppdVar20[8] = ppdVar11;
            lVar10 = 0;
            do {
              pppdVar20[8][lVar10] = (double *)0x0;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 6);
            ppdVar11 = pppdVar20[8];
          }
          iVar9 = (int)uVar13;
          ppdVar11[ver2edge[iVar9]] = (double *)ppdVar21;
          pppdVar1 = pppdVar20 + facepivot1[iVar9];
          pppdVar20 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
          uVar13 = (ulong)(uint)facepivot2[iVar9][(uint)*pppdVar1 & 0xf];
          ppdVar17 = local_f8;
        } while (pppdVar15 != pppdVar20);
        break;
      }
      if (local_f8 != (shellface)0x0) {
        iVar9 = this->shmarkindex;
        ppdVar17 = local_f8;
        do {
          uVar13 = (long)ppdVar17 - 1U & 0xffffffff;
          pppdVar14 = afStack_d8[uVar13].sh;
          if ((*(byte *)((long)pppdVar14 + (long)iVar9 * 4 + 4) & 4) != 0) {
            uVar18 = (ulong)pppdVar14[afStack_d8[uVar13].shver >> 1] & 0xfffffffffffffff8;
            uVar13 = (ulong)((uint)pppdVar14[afStack_d8[uVar13].shver >> 1] & 6);
            *(undefined8 *)(uVar18 + 0x30 + uVar13 * 4) = 0;
            uVar13 = *(ulong *)(uVar18 + uVar13 * 4);
            uVar18 = uVar13 & 0xfffffffffffffff8;
            if (uVar18 != 0) {
              *(undefined8 *)(uVar18 + 0x30 + (ulong)((uint)uVar13 & 6) * 4) = 0;
            }
            local_108.ver = (uint)pppdVar14[9] & 0xf;
            local_108.tet = (tetrahedron *)((ulong)pppdVar14[9] & 0xfffffffffffffff0);
            pppdVar15 = local_108.tet;
            uVar19 = local_108.ver;
            do {
              if (pppdVar15[8] != (tetrahedron)0x0) {
                pppdVar15[8][ver2edge[(int)uVar19]] = (double *)0x0;
              }
              pppdVar20 = pppdVar15 + facepivot1[(int)uVar19];
              pppdVar15 = (tetrahedron *)((ulong)*pppdVar20 & 0xfffffffffffffff0);
              uVar19 = facepivot2[(int)uVar19][(uint)*pppdVar20 & 0xf];
            } while (pppdVar15 != local_108.tet);
            pmVar5 = this->subsegs;
            pppdVar14[3] = (shellface)0x0;
            *pppdVar14 = (shellface)pmVar5->deaditemstack;
            pmVar5->deaditemstack = pppdVar14;
            pmVar5->items = pmVar5->items + -1;
          }
          bVar6 = 1 < (long)ppdVar17;
          ppdVar17 = (shellface)((long)ppdVar17 - 1U);
        } while (bVar6);
      }
      if (local_ec != 0) {
        if (2 < this->b->verbose) {
          printf("      Add a Steiner point in subedge (%d, %d).\n",
                 (ulong)*(uint *)((long)ppdVar21 + (long)this->pointmarkindex * 4),
                 (ulong)*(uint *)((long)endpt + (long)this->pointmarkindex * 4));
        }
        makepoint(this,&local_e8,FREEFACETVERTEX);
        pdVar7 = local_e8;
        lVar10 = 0;
        do {
          local_e8[lVar10] = ((double)ppdVar21[lVar10] + (double)endpt[lVar10]) * 0.5;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        local_108.tet = (tetrahedron *)((ulong)ppdVar21[this->point2simindex] & 0xfffffffffffffff0);
        if (local_108.tet[4] == ppdVar21) {
          local_108.ver = 0xb;
        }
        else if (local_108.tet[5] == ppdVar21) {
          local_108.ver = 3;
        }
        else {
          local_108.ver = 0;
          if (local_108.tet[6] == ppdVar21) {
            local_108.ver = 7;
          }
        }
        local_a8.sloc = 4;
        local_a8.sbowywat = 1;
        local_a8.iloc = 1;
        local_a8.bowywat = 1;
        local_a8.lawson = 0;
        local_a8.splitbdflag = 0;
        local_a8.validflag = 1;
        local_a8.respectbdflag = 1;
        local_a8.rejflag = 0;
        local_a8.chkencflag = 0;
        local_a8.assignmeshsize = this->b->metric;
        iVar9 = insertpoint(this,local_e8,&local_108,&local_118,(face *)0x0,&local_a8);
        if (iVar9 == 0) goto LAB_0013e4b1;
        paVar3 = this->subvertstack;
        pcVar16 = arraypool::getblock(paVar3,(int)paVar3->objects);
        uVar13 = paVar3->objects;
        paVar3->objects = uVar13 + 1;
        *(point *)(pcVar16 +
                  (long)paVar3->objectbytes * ((long)paVar3->objectsperblock - 1U & uVar13)) =
             pdVar7;
        this->st_facref_count = this->st_facref_count + 1;
        if (0 < this->steinerleft) {
          this->steinerleft = this->steinerleft + -1;
        }
      }
      if (local_f8 != (shellface)0x3) {
LAB_0013e43e:
        paVar3 = local_e0;
        if (local_e0 != (arraypool *)0x0) {
          pcVar16 = arraypool::getblock(local_e0,(int)local_e0->objects);
          lVar10 = (long)paVar3->objectbytes *
                   ((long)paVar3->objectsperblock - 1U & paVar3->objects);
          paVar3->objects = paVar3->objects + 1;
          *(shellface **)(pcVar16 + lVar10) = local_118.sh;
          *(int *)(pcVar16 + lVar10 + 8) = local_118.shver;
        }
        goto LAB_0013e489;
      }
LAB_0013dd97:
      lVar10 = (long)local_118.shver;
      local_f8 = local_118.sh[sorgpivot[lVar10]];
      ppdVar17 = local_118.sh[sdestpivot[lVar10]];
      ppdVar21 = local_118.sh[sapexpivot[lVar10]];
      iVar8 = recoverfacebyflips(this,(point)local_f8,(point)ppdVar17,(point)ppdVar21,&local_118,
                                 &local_108);
      pppdVar15 = local_108.tet;
      iVar9 = this->shmarkindex;
      lVar10 = 0;
      do {
        pppdVar14 = afStack_d8[lVar10].sh;
        if ((*(byte *)((long)pppdVar14 + (long)iVar9 * 4 + 4) & 4) != 0) {
          uVar18 = (ulong)pppdVar14[afStack_d8[lVar10].shver >> 1] & 0xfffffffffffffff8;
          uVar13 = (ulong)((uint)pppdVar14[afStack_d8[lVar10].shver >> 1] & 6);
          *(undefined8 *)(uVar18 + 0x30 + uVar13 * 4) = 0;
          uVar13 = *(ulong *)(uVar18 + uVar13 * 4);
          uVar18 = uVar13 & 0xfffffffffffffff8;
          if (uVar18 != 0) {
            *(undefined8 *)(uVar18 + 0x30 + (ulong)((uint)uVar13 & 6) * 4) = 0;
          }
          uVar19 = (uint)pppdVar14[9] & 0xf;
          uVar18 = (ulong)pppdVar14[9] & 0xfffffffffffffff0;
          uVar13 = uVar18;
          do {
            if (*(long *)(uVar13 + 0x40) != 0) {
              *(undefined8 *)(*(long *)(uVar13 + 0x40) + (long)ver2edge[(int)uVar19] * 8) = 0;
            }
            uVar4 = *(ulong *)(uVar13 + (long)facepivot1[(int)uVar19] * 8);
            uVar13 = uVar4 & 0xfffffffffffffff0;
            uVar19 = facepivot2[(int)uVar19][(uint)uVar4 & 0xf];
          } while (uVar13 != uVar18);
          pmVar5 = this->subsegs;
          pppdVar14[3] = (shellface)0x0;
          *pppdVar14 = (shellface)pmVar5->deaditemstack;
          pmVar5->deaditemstack = pppdVar14;
          pmVar5->items = pmVar5->items + -1;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      if (iVar8 == 0) {
        if (local_ec != 0) {
          if (2 < this->b->verbose) {
            lVar10 = (long)this->pointmarkindex;
            printf("      Add a Steiner point in subface (%d, %d, %d).\n",
                   (ulong)*(uint *)((long)local_f8 + lVar10 * 4),
                   (ulong)*(uint *)((long)ppdVar17 + lVar10 * 4),
                   (ulong)*(uint *)((long)ppdVar21 + lVar10 * 4));
          }
          makepoint(this,&local_e8,FREEFACETVERTEX);
          pdVar7 = local_e8;
          lVar10 = 0;
          do {
            local_e8[lVar10] =
                 ((double)local_f8[lVar10] + (double)ppdVar17[lVar10] + (double)ppdVar21[lVar10]) /
                 3.0;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          local_108.tet =
               (tetrahedron *)((ulong)local_f8[this->point2simindex] & 0xfffffffffffffff0);
          if (local_108.tet[4] == local_f8) {
            local_108.ver = 0xb;
          }
          else if (local_108.tet[5] == local_f8) {
            local_108.ver = 3;
          }
          else {
            local_108.ver = 0;
            if (local_108.tet[6] == local_f8) {
              local_108.ver = 7;
            }
          }
          local_a8.sloc = 3;
          local_a8.sbowywat = 1;
          local_a8.iloc = 1;
          local_a8.bowywat = 1;
          local_a8.lawson = 0;
          local_a8.splitbdflag = 0;
          local_a8.validflag = 1;
          local_a8.respectbdflag = 1;
          local_a8.rejflag = 0;
          local_a8.chkencflag = 0;
          local_a8.assignmeshsize = this->b->metric;
          iVar9 = insertpoint(this,local_e8,&local_108,&local_118,(face *)0x0,&local_a8);
          if (iVar9 != 0) {
            paVar3 = this->subvertstack;
            pcVar16 = arraypool::getblock(paVar3,(int)paVar3->objects);
            uVar13 = paVar3->objects;
            paVar3->objects = uVar13 + 1;
            *(point *)(pcVar16 +
                      (long)paVar3->objectbytes * ((long)paVar3->objectsperblock - 1U & uVar13)) =
                 pdVar7;
            this->st_facref_count = this->st_facref_count + 1;
            if (0 < this->steinerleft) {
              this->steinerleft = this->steinerleft + -1;
            }
            goto LAB_0013e43e;
          }
LAB_0013e4b1:
          puVar12 = (undefined4 *)__cxa_allocate_exception(4);
          *puVar12 = 2;
          __cxa_throw(puVar12,&int::typeinfo,0);
        }
        goto LAB_0013e43e;
      }
      if (local_118.sh != (shellface *)0x0) {
        ppdVar11 = local_108.tet[9];
        if (ppdVar11 == (tetrahedron)0x0) {
          ppdVar11 = (tetrahedron)memorypool::alloc(this->tet2subpool);
          pppdVar15[9] = ppdVar11;
          lVar10 = 0;
          do {
            pppdVar15[9][lVar10] = (double *)0x0;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          ppdVar11 = pppdVar15[9];
        }
        lVar10 = (long)local_108.ver;
        uVar13 = (ulong)((local_108.ver & 3U) << 3);
        *(ulong *)((long)ppdVar11 + uVar13) =
             (long)tsbondtbl[lVar10][local_118.shver] | (ulong)local_118.sh;
        local_118.sh[(ulong)(local_118.shver & 1) + 9] =
             (shellface)((long)stbondtbl[lVar10][local_118.shver] | (ulong)pppdVar15);
        uVar13 = *(ulong *)((long)pppdVar15 + uVar13);
        pppdVar15 = (tetrahedron *)(uVar13 & 0xfffffffffffffff0);
        uVar19 = fsymtbl[lVar10][(uint)uVar13 & 0xf];
        local_118.shver = local_118.shver ^ 1;
        ppdVar11 = pppdVar15[9];
        local_108.tet = pppdVar15;
        local_108.ver = uVar19;
        if (ppdVar11 == (tetrahedron)0x0) {
          ppdVar11 = (tetrahedron)memorypool::alloc(this->tet2subpool);
          pppdVar15[9] = ppdVar11;
          lVar10 = 0;
          do {
            pppdVar15[9][lVar10] = (double *)0x0;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          ppdVar11 = pppdVar15[9];
        }
        ppdVar11[uVar19 & 3] =
             (double *)((long)tsbondtbl[(int)uVar19][local_118.shver] | (ulong)local_118.sh);
        local_118.sh[(ulong)(local_118.shver & 1) + 9] =
             (shellface)((ulong)pppdVar15 | (long)stbondtbl[(int)uVar19][local_118.shver]);
      }
    }
LAB_0013e489:
    paVar3 = this->subfacstack;
    lVar10 = paVar3->objects;
  } while( true );
  local_118.shver = snextpivot[local_118.shver];
  ppdVar17 = (shellface)((long)ppdVar17 + 1);
  if (ppdVar17 == (shellface)0x3) goto LAB_0013dd97;
  goto LAB_0013db13;
}

Assistant:

int tetgenmesh::recoversubfaces(arraypool *misshlist, int steinerflag)
{
  triface searchtet, neightet, spintet;
  face searchsh, neighsh, neineish, *parysh;
  face bdsegs[3];
  point startpt, endpt, apexpt, *parypt;
  point steinerpt;
  insertvertexflags ivf;
  int success;
  int t1ver;
  int i, j;

  if (b->verbose > 1) {
    printf("    Recover subfaces [%s level = %2d] #:  %ld.\n",
           (b->fliplinklevel > 0) ? "fixed" : "auto",
           (b->fliplinklevel > 0) ? b->fliplinklevel : autofliplinklevel,
           subfacstack->objects);
  }

  // Loop until 'subfacstack' is empty.
  while (subfacstack->objects > 0l) {

    subfacstack->objects--;
    parysh = (face *) fastlookup(subfacstack, subfacstack->objects);
    searchsh = *parysh;

    if (searchsh.sh[3] == NULL) continue; // Skip a dead subface.

    stpivot(searchsh, neightet);
    if (neightet.tet != NULL) continue; // Skip a recovered subface.


    if (b->verbose > 2) {
      printf("      Recover subface (%d, %d, %d).\n",pointmark(sorg(searchsh)),
             pointmark(sdest(searchsh)), pointmark(sapex(searchsh)));
    }

    // The three edges of the face need to be existed first.
    for (i = 0; i < 3; i++) {
      sspivot(searchsh, bdsegs[i]);   
      if (bdsegs[i].sh != NULL) {
        // The segment must exist.
        sstpivot1(bdsegs[i], searchtet);
        if (searchtet.tet == NULL) {
          terminatetetgen(this, 2);
        }
      } else {
        // This edge is not a segment (due to a Steiner point).
        // Check whether it exists or not.
        success = 0;
        startpt = sorg(searchsh);
        endpt = sdest(searchsh);
        point2tetorg(startpt, searchtet);
        finddirection(&searchtet, endpt);
        if (dest(searchtet) == endpt) {
          success = 1;
        } else {
          // The edge is missing. Try to recover it.
          if (recoveredgebyflips(startpt, endpt, &searchsh, &searchtet, 0)) {
            success = 1;
          } else {
            if (recoveredgebyflips(endpt, startpt, &searchsh, &searchtet, 0)) {
              success = 1;
            }
          }
        }
        if (success) {
          // Insert a temporary segment to protect this edge.
          makeshellface(subsegs, &(bdsegs[i]));
          setshvertices(bdsegs[i], startpt, endpt, NULL);
          smarktest2(bdsegs[i]); // It's a temporary segment.
          // Insert this segment into surface mesh.
          ssbond(searchsh, bdsegs[i]);
          spivot(searchsh, neighsh);
          if (neighsh.sh != NULL) {
            ssbond(neighsh, bdsegs[i]);
          }
          // Insert this segment into tetrahedralization.
          sstbond1(bdsegs[i], searchtet);
          // Bond the segment to all tets containing it.
          spintet = searchtet;
          do {
            tssbond1(spintet, bdsegs[i]);
            fnextself(spintet);
          } while (spintet.tet != searchtet.tet);
        } else {
          // An edge of this subface is missing. Can't recover this subface.
          // Delete any temporary segment that has been created.
          for (j = (i - 1); j >= 0; j--) {
            if (smarktest2ed(bdsegs[j])) { 
              spivot(bdsegs[j], neineish);
                ssdissolve(neineish);
                spivot(neineish, neighsh);
                if (neighsh.sh != NULL) {
                  ssdissolve(neighsh);
                }
              sstpivot1(bdsegs[j], searchtet);
                spintet = searchtet;
                while (1) {
                  tssdissolve1(spintet);
                  fnextself(spintet);
                  if (spintet.tet == searchtet.tet) break;
                }
              shellfacedealloc(subsegs, bdsegs[j].sh);
            }
          } // j
          if (steinerflag) {
            // Add a Steiner point at the midpoint of this edge.
            if (b->verbose > 2) {
              printf("      Add a Steiner point in subedge (%d, %d).\n",
                     pointmark(startpt), pointmark(endpt));
            }
            makepoint(&steinerpt, FREEFACETVERTEX);
            for (j = 0; j < 3; j++) {
              steinerpt[j] = 0.5 * (startpt[j] + endpt[j]);
            }

            point2tetorg(startpt, searchtet); // Start from 'searchtet'.
            ivf.iloc = (int) OUTSIDE; // Need point location.
            ivf.bowywat = 1;
            ivf.lawson = 0;
            ivf.rejflag = 0;
            ivf.chkencflag = 0;
            ivf.sloc = (int) ONEDGE;            
            ivf.sbowywat = 1; // Allow flips in facet.
            ivf.splitbdflag = 0;
            ivf.validflag = 1;
            ivf.respectbdflag = 1;
            ivf.assignmeshsize = b->metric;
            if (!insertpoint(steinerpt, &searchtet, &searchsh, NULL, &ivf)) {
              terminatetetgen(this, 2);
            }
            // Save this Steiner point (for removal).
            //   Re-use the array 'subvertstack'.
            subvertstack->newindex((void **) &parypt);
            *parypt = steinerpt;

            st_facref_count++;
            if (steinerleft > 0) steinerleft--;
          } // if (steinerflag)
          break;
        }
      }
      senextself(searchsh);
    } // i

    if (i == 3) {
      // Recover the subface.
      startpt = sorg(searchsh);
      endpt   = sdest(searchsh);
      apexpt  = sapex(searchsh);

      success = recoverfacebyflips(startpt,endpt,apexpt,&searchsh,&searchtet);

      // Delete any temporary segment that has been created.
      for (j = 0; j < 3; j++) {
        if (smarktest2ed(bdsegs[j])) { 
          spivot(bdsegs[j], neineish);
            ssdissolve(neineish);
            spivot(neineish, neighsh);
            if (neighsh.sh != NULL) {
              ssdissolve(neighsh);
            }
          sstpivot1(bdsegs[j], neightet);
            spintet = neightet;
            while (1) {
              tssdissolve1(spintet);
              fnextself(spintet);
              if (spintet.tet == neightet.tet) break;
            }
          shellfacedealloc(subsegs, bdsegs[j].sh);
        }
      } // j

      if (success) {
        if (searchsh.sh != NULL) {
          // Face is recovered. Insert it.
          tsbond(searchtet, searchsh);
          fsymself(searchtet);
          sesymself(searchsh);
          tsbond(searchtet, searchsh);
        }
      } else {
        if (steinerflag) {
          // Add a Steiner point at the barycenter of this subface.
          if (b->verbose > 2) {
            printf("      Add a Steiner point in subface (%d, %d, %d).\n",
                   pointmark(startpt), pointmark(endpt), pointmark(apexpt));
          }
          makepoint(&steinerpt, FREEFACETVERTEX);
          for (j = 0; j < 3; j++) {
            steinerpt[j] = (startpt[j] + endpt[j] + apexpt[j]) / 3.0;
          }

          point2tetorg(startpt, searchtet); // Start from 'searchtet'.
          ivf.iloc = (int) OUTSIDE; // Need point location.
          ivf.bowywat = 1;
          ivf.lawson = 0;
          ivf.rejflag = 0;
          ivf.chkencflag = 0;
          ivf.sloc = (int) ONFACE;          
          ivf.sbowywat = 1; // Allow flips in facet.
          ivf.splitbdflag = 0;
          ivf.validflag = 1;
          ivf.respectbdflag = 1;
          ivf.assignmeshsize = b->metric; 
          if (!insertpoint(steinerpt, &searchtet, &searchsh, NULL, &ivf)) {
            terminatetetgen(this, 2);
          }
          // Save this Steiner point (for removal).
          //   Re-use the array 'subvertstack'.
          subvertstack->newindex((void **) &parypt);
          *parypt = steinerpt;

          st_facref_count++;
          if (steinerleft > 0) steinerleft--;
        } // if (steinerflag)
      }
    } else {
      success = 0;      
    }

    if (!success) {
      if (misshlist != NULL) {
        // Save this subface.
        misshlist->newindex((void **) &parysh);
        *parysh = searchsh;
      }
    }

  } // while (subfacstack->objects > 0l)

  return 0;
}